

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall
QNetworkRequestFactory::setTransferTimeout(QNetworkRequestFactory *this,milliseconds timeout)

{
  QNetworkRequestFactoryPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1->transferTimeout).__r != timeout.__r) {
    if ((pQVar1 != (QNetworkRequestFactoryPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach_helper(&this->d);
    }
    (((this->d).d.ptr)->transferTimeout).__r = timeout.__r;
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }